

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O3

void init_feed(feed_t *feed)

{
  feed->agencies = (agency_t *)0x0;
  feed->agency_count = 0;
  feed->calendar_dates = (calendar_date_t *)0x0;
  feed->calendar_dates_count = 0;
  feed->calendar_records = (calendar_record_t *)0x0;
  feed->calendar_records_count = 0;
  feed->fare_attributes = (fare_attributes_t *)0x0;
  feed->fare_attributes_count = 0;
  feed->fare_rules = (fare_rule_t *)0x0;
  feed->fare_rules_count = 0;
  feed->feed_info = (feed_info_t *)0x0;
  feed->feed_info_count = 0;
  feed->frequencies = (frequency_t *)0x0;
  feed->frequencies_count = 0;
  feed->levels = (level_t *)0x0;
  feed->levels_count = 0;
  feed->pathways = (pathway_t *)0x0;
  feed->pathways_count = 0;
  feed->routes = (route_t *)0x0;
  feed->routes_count = 0;
  feed->shapes = (shape_t *)0x0;
  feed->shapes_count = 0;
  feed->stop_times = (stop_time_t *)0x0;
  feed->stop_times_count = 0;
  feed->stops = (stop_t *)0x0;
  feed->stops_count = 0;
  feed->transfers = (transfer_t *)0x0;
  feed->transfers_count = 0;
  feed->trips = (trip_t *)0x0;
  feed->trips_count = 0;
  return;
}

Assistant:

void init_feed(feed_t *feed) {
    feed->agencies = NULL;
    feed->agency_count = 0;
    feed->calendar_dates = NULL;
    feed->calendar_dates_count = 0;
    feed->calendar_records = NULL;
    feed->calendar_records_count = 0;
    feed->fare_attributes = NULL;
    feed->fare_attributes_count = 0;
    feed->fare_rules = NULL;
    feed->fare_rules_count = 0;
    feed->feed_info = NULL;
    feed->feed_info_count = 0;
    feed->frequencies = NULL;
    feed->frequencies_count = 0;
    feed->levels = NULL;
    feed->levels_count = 0;
    feed->pathways = NULL;
    feed->pathways_count = 0;
    feed->routes = NULL;
    feed->routes_count = 0;
    feed->shapes = NULL;
    feed->shapes_count = 0;
    feed->stop_times = NULL;
    feed->stop_times_count = 0;
    feed->stops = NULL;
    feed->stops_count = 0;
    feed->transfers = NULL;
    feed->transfers_count = 0;
    feed->trips = NULL;
    feed->trips_count = 0;
}